

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_add(mp_int *a,mp_int *b,mp_int *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_RDX;
  mp_int *in_RSI;
  mp_int *in_RDI;
  int res;
  int sb;
  int sa;
  mp_int *in_stack_00000028;
  int local_24;
  
  iVar1 = in_RDI->sign;
  iVar2 = in_RSI->sign;
  if (iVar1 == iVar2) {
    *(int *)(in_RDX + 8) = iVar1;
    local_24 = s_mp_add(in_stack_00000028,a,b);
  }
  else {
    iVar3 = mp_cmp_mag(in_RDI,in_RSI);
    if (iVar3 == -1) {
      *(int *)(in_RDX + 8) = iVar2;
      local_24 = s_mp_sub(b,c,_sb);
    }
    else {
      *(int *)(in_RDX + 8) = iVar1;
      local_24 = s_mp_sub(b,c,_sb);
    }
  }
  return local_24;
}

Assistant:

int mp_add (mp_int * a, mp_int * b, mp_int * c)
{
  int     sa, sb, res;

  /* get sign of both inputs */
  sa = a->sign;
  sb = b->sign;

  /* handle two cases, not four */
  if (sa == sb) {
    /* both positive or both negative */
    /* add their magnitudes, copy the sign */
    c->sign = sa;
    res = s_mp_add (a, b, c);
  } else {
    /* one positive, the other negative */
    /* subtract the one with the greater magnitude from */
    /* the one of the lesser magnitude.  The result gets */
    /* the sign of the one with the greater magnitude. */
    if (mp_cmp_mag (a, b) == MP_LT) {
      c->sign = sb;
      res = s_mp_sub (b, a, c);
    } else {
      c->sign = sa;
      res = s_mp_sub (a, b, c);
    }
  }
  return res;
}